

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_serialization_unit_test.cpp
# Opt level: O0

void __thiscall
simplex_tree_custom_deserialization_vec_to_double::test_method
          (simplex_tree_custom_deserialization_vec_to_double *this)

{
  initializer_list<int> init;
  initializer_list<int> init_00;
  initializer_list<int> init_01;
  initializer_list<int> init_02;
  initializer_list<int> init_03;
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_520;
  basic_cstring<const_char> local_510;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_500;
  assertion_result local_4e0;
  basic_cstring<const_char> local_4c8;
  basic_cstring<const_char> local_4b8;
  char *local_4a8;
  char *stree_buffer;
  size_t stree_buffer_size;
  undefined1 local_490 [7];
  anon_class_1_0_00000001 deserialize_filtration_value;
  undefined4 local_474;
  undefined4 *local_470;
  size_t local_468;
  undefined1 local_460 [72];
  pointer local_418;
  int local_410 [2];
  int *local_408;
  stored_size_type local_400;
  undefined1 local_3f8 [72];
  undefined8 local_3b0;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 *local_398;
  pointer local_390;
  undefined1 local_388 [68];
  int local_344;
  undefined1 local_340 [32];
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  local_320;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  *local_318;
  pointer local_310;
  Vector_filtration_value local_308;
  int local_2ec [3];
  undefined1 local_2e0 [32];
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  local_2c0;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [24];
  int local_290 [2];
  undefined1 local_288 [32];
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  local_268;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  *local_260;
  undefined8 local_258;
  Vector_filtration_value local_250;
  int local_238 [4];
  undefined1 local_228 [32];
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  local_208;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>
  *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0 [28];
  int local_1d4 [3];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  target_st_type st_witness;
  undefined1 local_120 [8];
  target_st_type st_copy;
  source_st_type st;
  simplex_tree_custom_deserialization_vec_to_double *this_local;
  
  Gudhi::Simplex_tree<Simplex_tree_vec_fil>::Simplex_tree
            ((Simplex_tree<Simplex_tree_vec_fil> *)&st_copy.dimension_);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_120);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_1b8);
  local_1d4[0] = 2;
  local_1d4[1] = 1;
  local_1d4[2] = 0;
  local_1c8._0_8_ = local_1d4;
  local_1c8._8_8_ = (pointer)0x3;
  local_208.m_ptr._0_4_ = 3;
  local_208.m_ptr._4_4_ = 1;
  local_200 = &local_208;
  local_1f8 = 2;
  init_03._M_len = 2;
  init_03._M_array = (iterator)local_200;
  Gudhi::Vector_filtration_value::Vector_filtration_value
            ((Vector_filtration_value *)local_1f0,init_03);
  Gudhi::Simplex_tree<Simplex_tree_vec_fil>::insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_vec_fil> *)(local_228 + 0x10),
             (initializer_list<int> *)&st_copy.dimension_,
             (Filtration_value *)((long)local_1d4 + 0xc));
  Gudhi::Vector_filtration_value::~Vector_filtration_value((Vector_filtration_value *)local_1f0);
  local_238[0] = 0;
  local_238[1] = 1;
  local_238[2] = 6;
  local_238[3] = 7;
  local_228._0_8_ = local_238;
  local_228._8_8_ = (pointer)0x4;
  local_268.m_ptr._0_4_ = 4;
  local_268.m_ptr._4_4_ = 1;
  local_260 = &local_268;
  local_258 = 2;
  init_02._M_len = 2;
  init_02._M_array = (iterator)local_260;
  Gudhi::Vector_filtration_value::Vector_filtration_value(&local_250,init_02);
  Gudhi::Simplex_tree<Simplex_tree_vec_fil>::insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_vec_fil> *)(local_288 + 0x10),
             (initializer_list<int> *)&st_copy.dimension_,(Filtration_value *)local_228);
  Gudhi::Vector_filtration_value::~Vector_filtration_value(&local_250);
  local_290[0] = 3;
  local_290[1] = 0;
  local_288._0_8_ = local_290;
  local_288._8_8_ = (pointer)0x2;
  local_2c0.m_ptr._0_4_ = 2;
  local_2c0.m_ptr._4_4_ = 1;
  local_2b8 = &local_2c0;
  local_2b0 = 2;
  init_01._M_len = 2;
  init_01._M_array = (iterator)local_2b8;
  Gudhi::Vector_filtration_value::Vector_filtration_value
            ((Vector_filtration_value *)local_2a8,init_01);
  Gudhi::Simplex_tree<Simplex_tree_vec_fil>::insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_vec_fil> *)(local_2e0 + 0x10),
             (initializer_list<int> *)&st_copy.dimension_,(Filtration_value *)local_288);
  Gudhi::Vector_filtration_value::~Vector_filtration_value((Vector_filtration_value *)local_2a8);
  local_2ec[0] = 3;
  local_2ec[1] = 4;
  local_2ec[2] = 5;
  local_2e0._0_8_ = local_2ec;
  local_2e0._8_8_ = (pointer)0x3;
  local_320.m_ptr._0_4_ = 3;
  local_320.m_ptr._4_4_ = 1;
  local_318 = &local_320;
  local_310 = (pointer)0x2;
  init_00._M_len = 2;
  init_00._M_array = (iterator)local_318;
  Gudhi::Vector_filtration_value::Vector_filtration_value(&local_308,init_00);
  Gudhi::Simplex_tree<Simplex_tree_vec_fil>::insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_vec_fil> *)(local_340 + 0x10),
             (initializer_list<int> *)&st_copy.dimension_,(Filtration_value *)local_2e0);
  Gudhi::Vector_filtration_value::~Vector_filtration_value(&local_308);
  local_344 = 8;
  local_340._0_8_ = &local_344;
  local_340._8_8_ = (pointer)0x1;
  local_388._16_4_ = 1;
  local_388._20_4_ = 1;
  local_388._24_8_ = local_388 + 0x10;
  local_388._32_8_ = 2;
  init._M_len = 2;
  init._M_array = (iterator)local_388._24_8_;
  Gudhi::Vector_filtration_value::Vector_filtration_value
            ((Vector_filtration_value *)(local_388 + 0x28),init);
  Gudhi::Simplex_tree<Simplex_tree_vec_fil>::insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Simplex_tree_vec_fil> *)local_388,
             (initializer_list<int> *)&st_copy.dimension_,(Filtration_value *)local_340);
  Gudhi::Vector_filtration_value::~Vector_filtration_value
            ((Vector_filtration_value *)(local_388 + 0x28));
  local_3a4 = 2;
  local_3a0 = 1;
  local_39c = 0;
  local_398 = &local_3a4;
  local_390 = (pointer)0x3;
  local_3b0._0_4_ = 0;
  local_3b0._4_4_ = 0x40080000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)(local_3f8 + 0x38),
             (initializer_list<int> *)local_1b8,(Filtration_value *)&local_398);
  local_3f8._24_4_ = 0;
  local_3f8._28_4_ = 1;
  local_3f8._32_4_ = 8.40779e-45;
  local_3f8._36_4_ = 7;
  local_3f8._40_8_ = local_3f8 + 0x18;
  local_3f8._48_8_ = (__node_base_ptr)0x4;
  local_3f8._16_8_ = (_Hash_node_base *)0x4010000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_3f8,
             (initializer_list<int> *)local_1b8,(Filtration_value *)(local_3f8 + 0x28));
  local_410[0] = 3;
  local_410[1] = 0;
  local_408 = local_410;
  local_400 = 2;
  local_418 = (pointer)0x4000000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)(local_460 + 0x38),
             (initializer_list<int> *)local_1b8,(Filtration_value *)&local_408);
  local_460._28_4_ = 3;
  local_460._32_4_ = 5.60519e-45;
  local_460._36_4_ = 5;
  local_460._40_8_ = local_460 + 0x1c;
  local_460._48_8_ = (__node_base_ptr)0x3;
  local_460._16_8_ = (_Hash_node_base *)0x4008000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_460,
             (initializer_list<int> *)local_1b8,(Filtration_value *)(local_460 + 0x28));
  local_474 = 8;
  local_470 = &local_474;
  local_468 = 1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_490,
             (initializer_list<int> *)local_1b8,(Filtration_value *)&local_470);
  stree_buffer = (char *)Gudhi::Simplex_tree<Simplex_tree_vec_fil>::get_serialization_size
                                   ((Simplex_tree<Simplex_tree_vec_fil> *)&st_copy.dimension_);
  local_4a8 = (char *)operator_new__((ulong)stree_buffer);
  Gudhi::Simplex_tree<Simplex_tree_vec_fil>::serialize
            ((Simplex_tree<Simplex_tree_vec_fil> *)&st_copy.dimension_,local_4a8,
             (size_t)stree_buffer);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  deserialize<simplex_tree_custom_deserialization_vec_to_double::test_method()::__0&>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_120,local_4a8,
             (size_t)stree_buffer,(anon_class_1_0_00000001 *)((long)&stree_buffer_size + 7));
  if (local_4a8 != (char *)0x0) {
    operator_delete__(local_4a8);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
               ,0x84);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b8,0x195,&local_4c8);
    bVar2 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::operator==
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_1b8,
                       (Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_120);
    boost::test_tools::assertion_result::assertion_result(&local_4e0,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_510,"st_witness == st_copy",0x15);
    boost::unit_test::operator<<(&local_500,prev,&local_510);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_520,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
               ,0x84);
    boost::test_tools::tt_detail::report_assertion(&local_4e0,&local_500,&local_520,0x195,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_500);
    boost::test_tools::assertion_result::~assertion_result(&local_4e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_1b8);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_120);
  Gudhi::Simplex_tree<Simplex_tree_vec_fil>::~Simplex_tree
            ((Simplex_tree<Simplex_tree_vec_fil> *)&st_copy.dimension_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(simplex_tree_custom_deserialization_vec_to_double) {
  using source_st_type = Simplex_tree<Simplex_tree_vec_fil>;
  using target_st_type = Simplex_tree<Simplex_tree_options_default>;

  source_st_type st;
  target_st_type st_copy;
  target_st_type st_witness;

  st.insert_simplex_and_subfaces({2, 1, 0}, {3, 1});
  st.insert_simplex_and_subfaces({0, 1, 6, 7}, {4, 1});
  st.insert_simplex_and_subfaces({3, 0}, {2, 1});
  st.insert_simplex_and_subfaces({3, 4, 5}, {3, 1});
  st.insert_simplex_and_subfaces({8}, {1, 1});

  st_witness.insert_simplex_and_subfaces({2, 1, 0}, 3.0);
  st_witness.insert_simplex_and_subfaces({0, 1, 6, 7}, 4.0);
  st_witness.insert_simplex_and_subfaces({3, 0}, 2.0);
  st_witness.insert_simplex_and_subfaces({3, 4, 5}, 3.0);
  st_witness.insert_simplex_and_subfaces({8}, 1.0);

  auto deserialize_filtration_value = [](typename target_st_type::Filtration_value& fil,
                                         const char* start) -> const char* {
    typename source_st_type::Filtration_value origin_fil;
    const char* ptr = deserialize_value_from_char_buffer(origin_fil, start); //naive way to do it, but fine enough for a test
    fil = origin_fil[0];
    return ptr;
  };

  const std::size_t stree_buffer_size = st.get_serialization_size();
  char* stree_buffer = new char[stree_buffer_size];
  st.serialize(stree_buffer, stree_buffer_size);

  st_copy.deserialize(stree_buffer, stree_buffer_size, deserialize_filtration_value);
  delete[] stree_buffer;

  BOOST_CHECK(st_witness == st_copy);
}